

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::TransformFeedback::CheckGetXFBVarying::check
          (CheckGetXFBVarying *this,GLuint program,GLuint capture_way,GLuint shader_case,
          GLuint varying_type,GLuint number_of_attributes)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  GLint i_00;
  uint local_fc;
  GLenum local_f8;
  GLint xfb_varying_max_length;
  GLint xfb_mode;
  GLint xfb_varyings;
  GLuint size_ref;
  allocator<char> local_c1;
  string local_c0 [8];
  string varying_ref;
  allocator<char> local_89;
  string local_88 [8];
  string varying;
  GLchar name [18];
  int local_4c;
  GLenum type;
  GLsizei size;
  GLsizei length;
  GLsizei bufSize;
  GLuint i;
  GLuint max_length;
  Functions *gl;
  GLuint local_28;
  GLuint number_of_attributes_local;
  GLuint varying_type_local;
  GLuint shader_case_local;
  GLuint capture_way_local;
  GLuint program_local;
  CheckGetXFBVarying *this_local;
  
  gl._4_4_ = number_of_attributes;
  local_28 = varying_type;
  number_of_attributes_local = shader_case;
  varying_type_local = capture_way;
  shader_case_local = program;
  _capture_way_local = this;
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _i = CONCAT44(extraout_var,iVar1);
  bufSize = 0;
  length = 0;
  do {
    if (gl._4_4_ <= (uint)length) {
      xfb_varying_max_length = 0;
      local_f8 = 0;
      local_fc = 0;
      (**(code **)(_i + 0x9d8))(shader_case_local,0x8c83,&xfb_varying_max_length);
      (**(code **)(_i + 0x9d8))(shader_case_local,0x8c7f,&local_f8);
      (**(code **)(_i + 0x9d8))(shader_case_local,0x8c76,&local_fc);
      dVar2 = (**(code **)(_i + 0x800))();
      glu::checkError(dVar2,"glGetProgramiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0xea1);
      if (xfb_varying_max_length == gl._4_4_) {
        if (local_f8 == s_capture_ways[varying_type_local]) {
          if (local_fc < (uint)bufSize) {
            this_local._7_1_ = 0;
          }
          else {
            this_local._7_1_ = 1;
          }
        }
        else {
          this_local._7_1_ = 0;
        }
      }
      else {
        this_local._7_1_ = 0;
      }
LAB_00e2ff06:
      return (bool)(this_local._7_1_ & 1);
    }
    size = 0x12;
    type = 0;
    local_4c = 0;
    stack0xffffffffffffffb0 = 0;
    memset((void *)((long)&varying.field_2 + 8),0,0x12);
    (**(code **)(_i + 0xb18))
              (shader_case_local,length,0x12,&type,&local_4c,name + 0x10,
               (undefined1 *)((long)&varying.field_2 + 8));
    dVar2 = (**(code **)(_i + 0x800))();
    glu::checkError(dVar2,"glGetTransformFeedbackVarying call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xe74);
    bufSize = deMaxu32(bufSize,type);
    if (type == 0) {
      this_local._7_1_ = 0;
      goto LAB_00e2ff06;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_88,varying.field_2._M_local_buf + 8,&local_89);
    std::allocator<char>::~allocator(&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c0,"result_",&local_c1);
    std::allocator<char>::~allocator(&local_c1);
    Utilities::itoa_abi_cxx11_((string *)&size_ref,(Utilities *)(ulong)(uint)length,i_00);
    std::__cxx11::string::append(local_c0);
    std::__cxx11::string::~string((string *)&size_ref);
    iVar1 = std::__cxx11::string::compare(local_88);
    if (iVar1 != 0) {
      this_local._7_1_ = 0;
    }
    xfb_varyings = (GLint)(iVar1 != 0);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_88);
    if (xfb_varyings != 0) goto LAB_00e2ff06;
    xfb_mode = 1;
    if (local_4c != 1) {
      this_local._7_1_ = 0;
      goto LAB_00e2ff06;
    }
    if (stack0xffffffffffffffb0 != s_varying_types[local_28].type) {
      this_local._7_1_ = 0;
      goto LAB_00e2ff06;
    }
    length = length + 1;
  } while( true );
}

Assistant:

bool gl3cts::TransformFeedback::CheckGetXFBVarying::check(glw::GLuint program, glw::GLuint capture_way,
														  glw::GLuint shader_case UNUSED, glw::GLuint varying_type,
														  glw::GLuint number_of_attributes)
{
	/* Functions handler */
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();
	glw::GLuint			  max_length = 0;

	/* Inspect glGetTransformFeedbackVarying. */
	for (glw::GLuint i = 0; i < number_of_attributes; ++i)
	{
		const glw::GLsizei bufSize  = 18;
		glw::GLsizei	   length   = 0;
		glw::GLsizei	   size		= 0;
		glw::GLenum		   type		= GL_NONE;
		glw::GLchar		   name[18] = { 0 }; /* Size of bufSize. */

		gl.getTransformFeedbackVarying(program, i, bufSize, &length, &size, &type, name);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTransformFeedbackVarying call failed.");

		max_length = deMaxu32(max_length, glw::GLuint(length));

		/* Check name. */
		if (length)
		{
			std::string varying		= name;
			std::string varying_ref = "result_";
			varying_ref.append(gl3cts::TransformFeedback::Utilities::itoa(i));

			if (0 != varying.compare(varying_ref))
			{
				return false;
			}
		}
		else
		{
			return false;
		}

		/* Check size. */
		const glw::GLuint size_ref = 1;

		if (size != size_ref)
		{
			return false;
		}

		/* Check type. */
		if (type != s_varying_types[varying_type].type)
		{
			return false;
		}
	}

	/* Inspect glGetProgramiv. */
	glw::GLint xfb_varyings			  = 0;
	glw::GLint xfb_mode				  = 0;
	glw::GLint xfb_varying_max_length = 0;

	gl.getProgramiv(program, GL_TRANSFORM_FEEDBACK_VARYINGS, &xfb_varyings);
	gl.getProgramiv(program, GL_TRANSFORM_FEEDBACK_BUFFER_MODE, &xfb_mode);
	gl.getProgramiv(program, GL_TRANSFORM_FEEDBACK_VARYING_MAX_LENGTH, &xfb_varying_max_length);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

	if (glw::GLuint(xfb_varyings) != number_of_attributes)
	{
		return false;
	}

	if (glw::GLenum(xfb_mode) != s_capture_ways[capture_way])
	{
		return false;
	}

	if (glw::GLuint(xfb_varying_max_length) < max_length)
	{
		return false;
	}

	return true;
}